

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirit2_playground.cpp
# Opt level: O2

void __thiscall
client::
mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::mini_xml_grammar(mini_xml_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this)

{
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *this_00;
  string *this_01;
  undefined1 *puVar1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  eVar2;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[17]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::parameterized_nonterminal<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::fusion::vector<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>_>_>_>,_0L>
  that_4;
  car_type when_print;
  car_type switch_to_print;
  car_type transitions_from_print;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[10]>_>_>,_0L>
  that_1;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_3;
  undefined1 local_13b [3];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_138;
  proto_child0 local_130;
  string local_128;
  undefined1 local_108 [16];
  proto_child0 local_f8;
  undefined1 local_f0 [16];
  proto_child0 local_e0;
  undefined1 local_d8 [24];
  vtable_base *local_c0;
  vtable_base *local_b8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_b0;
  proto_child0 local_a8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_a0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_98;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_90;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_88;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_80;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_78;
  vtable_base local_70;
  undefined1 *local_68;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_60;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_58;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_50;
  string *local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined1 *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-grammar",(allocator<char> *)&local_138);
  this_00 = &this->xml;
  (this->
  super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->
             super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
             ).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_48 = this_01;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_50 = this_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  local_78 = &this->node;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::variant<boost::recursive_wrapper<client::mini_xml>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_78,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->text,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_58 = &this->text;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->start_tag,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_80.child0.ref.t_ = (proto_child0)(proto_child0)&this->start_tag;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->end_tag,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  local_88 = &this->end_tag;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  local_60 = &this->transitions_declaration;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_60,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  local_90.child0.ref.t_ = (proto_child0)&this->transitions_from;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_90.child0.ref.t_,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  local_98 = &this->switch_to;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_98,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"unnamed-rule",(allocator<char> *)&local_138);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->when,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  prVar3 = local_58;
  local_108._8_8_ = local_108 + 0x10;
  local_f8.ref.t_._0_1_ = 0x3c;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_108._0_8_ = &boost::spirit::ascii::char_;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_f0 + 8);
  local_128._M_string_length = (size_type)(local_d8 + 0x10);
  local_128._M_dataplus._M_p = "";
  local_d8._16_8_ = (allocator<char> *)&local_138;
  local_a0 = &this->when;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>>
            (local_58,&local_128);
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )prVar3;
  local_128._M_string_length = (size_type)local_108;
  local_138 = this_00;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::variant<boost::recursive_wrapper<client::mini_xml>,std::__cxx11::string>(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,client::mini_xml(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>>
            (local_78);
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_13b;
  local_13b[0] = 0x74;
  local_f0._8_8_ = &boost::spirit::ascii::char_;
  local_d8._16_8_ = local_d8;
  local_d8._0_8_ = local_f0 + 8;
  local_f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x10a4ae;
  local_c0 = (vtable_base *)(local_108 + 0x10);
  local_108._8_8_ = local_d8 + 0xc;
  local_d8[0xc] = '(';
  local_108._0_8_ = (long)local_d8 + 0x10;
  local_38 = local_d8 + 0xb;
  local_d8[0xb] = ')';
  _local_40 = (proto_child0)&boost::spirit::ascii::char_;
  puVar1 = local_13b + 1;
  local_128._M_string_length = (size_type)(local_d8 + 10);
  local_d8[10] = ')';
  local_b0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&boost::spirit::lexeme;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b0;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_b8 = &local_70;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b8;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &stack0xffffffffffffffc0;
  local_68 = puVar1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost:___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_90.child0.ref.t_);
  local_d8._16_8_ = "switch_to";
  local_d8[0] = '(';
  local_108._0_8_ = (long)local_d8 + 0x10;
  local_108._8_8_ = local_d8;
  local_b8._0_1_ = 0x29;
  local_b0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&boost::spirit::ascii::char_;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       (local_108 + 0x10);
  local_f0._8_8_ = &boost::spirit::lexeme;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_f0 + 8);
  local_13b[1] = 0x29;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_128._M_string_length = (size_type)puVar1;
  local_f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b0;
  local_f0._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&stack0xffffffffffffffc0;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_70;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b8;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[10]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_98);
  local_d8._16_8_ = "when";
  local_d8[0] = '(';
  eVar2.child0.ref.t_ = (proto_child0)((long)local_d8 + 0x10);
  local_108._8_8_ = local_d8;
  local_b8._0_1_ = 0x29;
  local_b0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&boost::spirit::ascii::char_;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       (local_108 + 0x10);
  local_f0._8_8_ = &boost::spirit::lexeme;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_70;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_13b[1] = 0x29;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(local_f0 + 8);
  local_128._M_string_length = (size_type)puVar1;
  local_108._0_8_ = eVar2.child0.ref.t_;
  local_f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b0;
  local_f0._0_8_ =
       (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)&stack0xffffffffffffffc0;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b8;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[5]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_a0);
  local_b8._0_1_ = 0x3c;
  local_40 = 0x2f;
  local_13b[1] = 0x3e;
  local_f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::ascii::char_;
  local_f0._8_8_ = local_108 + 0x10;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d8;
  local_d8._16_8_ = &boost::spirit::lexeme;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_13b[0] = 0x3e;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_128._M_string_length = (size_type)local_13b;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar2.child0.ref.t_;
  local_108._0_8_ = &local_b8;
  local_108._8_8_ = &local_b0;
  local_f0._0_8_ = puVar1;
  local_c0 = &local_70;
  local_b0 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)&stack0xffffffffffffffc0;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       (local_f0 + 8);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::logical_not,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::ascii>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::spirit::attribute<0>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,1l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_80.child0.ref.t_);
  prVar3 = local_a0;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x10a4ce;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_108;
  local_d8[0x10] = 0x3e;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_128._M_string_length = (size_type)eVar2.child0.ref.t_;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void(std::__cxx11::string),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[3]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::lazy_terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::ascii>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,boost::spirit::char_encoding::ascii>>,boost::phoenix::actor<boost::spirit::attribute<1>>>,2l>>,1>>,0l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_88);
  local_108._0_8_ = local_90.child0.ref.t_;
  local_108._8_8_ = local_d8 + 0xf;
  local_b0 = local_98;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_d8 + 0xe);
  local_f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_d8;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)prVar3;
  local_68 = local_d8 + 0xd;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&stack0xffffffffffffffc0;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_d8[0] = 0x2e;
  local_b8 = (vtable_base *)CONCAT71(local_b8._1_7_,0x2e);
  local_13b[1] = 0x3b;
  local_128._M_string_length = (size_type)puVar1;
  local_f0._0_8_ = &local_b0;
  local_f0._8_8_ = local_108 + 0x10;
  local_e0.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_b8;
  local_d8._16_8_ = local_f0 + 8;
  local_c0 = &local_70;
  _local_40 = eVar2.child0.ref.t_;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::string(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>,boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<client::mini_xml_grammar<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::mini_xml_grammar()::_lambda(std::__cxx11::string_const&)_1_&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost:___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_60);
  local_108._0_8_ = local_80.child0.ref.t_;
  local_d8._16_8_ = local_78;
  local_138 = (rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_108;
  local_f0._8_8_ = local_88;
  local_128._M_dataplus._M_p = (pointer)&local_138;
  local_130.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(local_108 + 0x10);
  local_128._M_string_length = (size_type)(local_f0 + 8);
  local_108._8_8_ = &local_70;
  local_f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar2.child0.ref.t_;
  local_c0 = (vtable_base *)&local_b0;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_client::mini_xml_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_48bac73_>(local_50);
  return;
}

Assistant:

mini_xml_grammar() : mini_xml_grammar::base_type(xml)
        {
            using qi::lit;
            using qi::lexeme;
            using ascii::char_;
            using ascii::string;
            using namespace qi::labels;

            using phoenix::at_c;
            using phoenix::push_back;

            auto transitions_from_print = [](const std::string& s) {std::cout << "transitions_from: '" << s  << "'" << std::endl; };
            auto switch_to_print = [](const std::string& s) {std::cout << "switch_to: '" << s  << "'" << std::endl; };
            auto when_print = [](const std::string& s) {std::cout << "when: '" << s  << "'" << std::endl; };

            text = lexeme[+(char_ - '<')        [_val += _1]];
            node = (xml | text)                 [_val = _1];

            transitions_from =
                *(char_ - 't')
                >> lit("transitions_from")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            switch_to =
                   lit("switch_to")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            when =
                   lit("when")
                >> '('
                >> lexeme[+(char_ - ')')       [_val += _1]]
                >> ')'
            ;

            start_tag =
                    '<'
                >>  !lit('/')
                >>  lexeme[+(char_ - '>')       [_val += _1]]
                >>  '>'
            ;

            end_tag =
                    "</"
                >>  string(_r1)
                >>  '>'
            ;

            transitions_declaration =
                    transitions_from[transitions_from_print]
                >>  *( '.' >> switch_to[switch_to_print] >> '.' >> when[when_print])
                >>  ';'
            ;

//            xml =
//                    transitions_declaration
//                    >> '}'


            xml =
                start_tag                 [at_c<0>(_val) = _1]
                >>  *node                 [push_back(at_c<1>(_val), _1)]
                >>  end_tag(at_c<0>(_val))
            ;
//            xml =
//                    start_tag                   [at_c<0>(_val) = _1]
//                >>  *node                       [push_back(at_c<1>(_val), _1)]
//                >>  end_tag(at_c<0>(_val))
//            ;
        }